

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O3

bool dg::vr::Relations::transitiveOver(Type fst,Type snd)

{
  bool bVar1;
  
  switch(fst) {
  case EQ:
  case NE:
  case PT:
  case PF:
    return false;
  case SLE:
  case SLT:
    bVar1 = (snd & ~NE) == SLE;
    break;
  case ULE:
  case ULT:
    bVar1 = (snd & ~NE) == ULE;
    break;
  case SGE:
  case SGT:
    bVar1 = (snd & ~NE) == SGE;
    break;
  case UGE:
  case UGT:
    bVar1 = (snd & ~NE) == UGE;
    break;
  default:
    abort();
  }
  return bVar1;
}

Assistant:

bool Relations::transitiveOver(Type fst, Type snd) {
    switch (fst) {
    case SLE:
    case SLT:
        return snd == SLE || snd == SLT;
    case ULE:
    case ULT:
        return snd == ULE || snd == ULT;
    case SGE:
    case SGT:
        return snd == SGE || snd == SGT;
    case UGE:
    case UGT:
        return snd == UGE || snd == UGT;
    case EQ:
    case NE:
    case PT:
    case PF:
        return false;
    }
    assert(0 && "unreachable");
    abort();
}